

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

boolean findtravelpath(_func_boolean_int_int *guess,schar *dx,schar *dy)

{
  char cVar1;
  bool bVar2;
  boolean bVar3;
  char cVar4;
  int iVar5;
  int uy_00;
  int iVar6;
  int x_00;
  int y_00;
  int iVar7;
  obj *poVar8;
  bool bVar9;
  uint auStack_4668 [1110];
  monst *local_3510;
  int iStack_3500;
  boolean autoexploring;
  int nd2;
  int d2;
  int nxtdist;
  int dist;
  int py;
  int px;
  int ny;
  int nx;
  boolean divert_mon;
  monst *mtmp;
  boolean alreadyrepeated;
  int dirmax;
  int y;
  int x;
  int dir;
  int nn;
  int i;
  int radius;
  int set;
  int n;
  xchar uy;
  xchar ux;
  xchar ty;
  xchar tx;
  xchar travelstepy [2] [1680];
  xchar travelstepx [2] [1680];
  uint travel [80] [21];
  schar *dy_local;
  schar *dx_local;
  _func_boolean_int_int *guess_local;
  
  if (((guess == (_func_boolean_int_int *)0x0) && (iflags.travel1 != '\0')) &&
     (iVar5 = distmin((int)u.ux,(int)u.uy,(int)u.tx,(int)u.ty), iVar5 == 1)) {
    flags.run = 0;
    bVar3 = test_move((int)u.ux,(int)u.uy,(int)u.tx - (int)u.ux,(int)u.ty - (int)u.uy,0,1);
    if (bVar3 != '\0') {
      *dx = u.tx - u.ux;
      *dy = u.ty - u.uy;
      nomul(0,(char *)0x0);
      iflags.travelcc.x = -1;
      iflags.travelcc.y = -1;
      return '\x01';
    }
    flags.run = 8;
  }
  if (((u.tx != u.ux) || (u.ty != u.uy)) || (guess == unexplored)) {
    dx_local = (schar *)guess;
    if (guess == (_func_boolean_int_int *)0x0) {
      set._3_1_ = u.tx;
      set._2_1_ = u.ty;
      set._1_1_ = u.ux;
      set._0_1_ = u.uy;
    }
    else {
      set._3_1_ = u.ux;
      set._2_1_ = u.uy;
      set._1_1_ = u.tx;
      set._0_1_ = u.ty;
    }
    do {
      radius = 1;
      i = 0;
      nn = 1;
      memset(travelstepx[1] + 0x688,0,0x1a40);
      travelstepy[1][0x688] = set._3_1_;
      n._0_1_ = set._2_1_;
      while (radius != 0) {
        x = 0;
        for (dir = 0; dir < radius; dir = dir + 1) {
          cVar4 = travelstepy[(long)i + 1][(long)dir + 0x688];
          iVar5 = (int)cVar4;
          cVar1 = *(char *)((long)&n + (long)dir + (long)i * 0x690);
          uy_00 = (int)cVar1;
          iVar6 = 8;
          if (u.umonnum == 0x78) {
            iVar6 = 4;
          }
          bVar2 = false;
          for (y = 0; y < iVar6; y = y + 1) {
            x_00 = iVar5 + xdir[findtravelpath::ordered[y]];
            y_00 = uy_00 + ""[findtravelpath::ordered[y]];
            if (((0 < x_00) && (x_00 < 0x50)) &&
               (((-1 < y_00 && (y_00 < 0x15)) &&
                (((code *)dx_local != couldsee_func ||
                 (bVar3 = couldsee_func(x_00,y_00), bVar3 != '\0')))))) {
              if ((level->monsters[x_00][y_00] == (monst *)0x0) ||
                 ((*(uint *)&level->monsters[x_00][y_00]->field_0x60 >> 9 & 1) != 0)) {
                local_3510 = (monst *)0x0;
              }
              else {
                local_3510 = level->monsters[x_00][y_00];
              }
              bVar9 = false;
              if (local_3510 != (monst *)0x0) {
                if (local_3510->wormno == '\0') {
                  if (((viz_array[local_3510->my][local_3510->mx] & 2U) != 0) ||
                     ((((u.uprops[0x1e].intrinsic == 0 &&
                        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                      (((u.uprops[0x40].intrinsic != 0 ||
                        ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)
                         ))) && (((local_3510->data->mflags3 & 0x200) != 0 &&
                                 ((viz_array[local_3510->my][local_3510->mx] & 1U) != 0))))))))
                  goto LAB_001eaecb;
LAB_001eaf61:
                  if (((((local_3510->data->mflags1 & 0x10000) != 0) ||
                       ((poVar8 = which_armor(local_3510,4), poVar8 != (obj *)0x0 &&
                        (poVar8 = which_armor(local_3510,4), poVar8->otyp == 0x4f)))) ||
                      ((((u.uprops[0x1e].intrinsic == 0 &&
                         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                        ((((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                          ((((u.uprops[0x19].intrinsic == 0 &&
                             ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                            (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))) ||
                         (u.uprops[0x19].blocked != 0)))) &&
                       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
                        (iVar7 = dist2((int)local_3510->mx,(int)local_3510->my,(int)u.ux,(int)u.uy),
                        0x40 < iVar7)))))) &&
                     ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)))) {
                    bVar3 = match_warn_of_mon(local_3510);
                    bVar9 = false;
                    if (bVar3 == '\0') goto LAB_001eb272;
                  }
                }
                else {
                  bVar3 = worm_known(level,local_3510);
                  if (bVar3 == '\0') goto LAB_001eaf61;
LAB_001eaecb:
                  if ((((((*(uint *)&local_3510->field_0x60 >> 1 & 1) != 0) &&
                        (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) &&
                      (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
                     ((((*(uint *)&local_3510->field_0x60 >> 7 & 1) != 0 ||
                       ((*(uint *)&local_3510->field_0x60 >> 9 & 1) != 0)) ||
                      (((byte)u._1052_1_ >> 5 & 1) != 0)))) goto LAB_001eaf61;
                }
                bVar9 = false;
                if (((local_3510->m_ap_type != '\x01') &&
                    (bVar9 = false, local_3510->m_ap_type != '\x02')) &&
                   ((bVar9 = false, (local_3510->data->mflags1 & 0x100) == 0 &&
                    (bVar9 = false, (*(uint *)&local_3510->field_0x60 >> 7 & 1) == 0)))) {
                  if ((*(uint *)&local_3510->field_0x60 >> 0x16 & 1) != 0) {
                    bVar9 = true;
                    if ((u.uprops[0x23].intrinsic == 0) ||
                       (bVar9 = true, u.uprops[0x24].extrinsic != 0)) goto LAB_001eb272;
                    if (u.umonnum != u.umonster) {
                      bVar3 = dmgtype(youmonst.data,0x24);
                      bVar9 = true;
                      if (bVar3 != '\0') goto LAB_001eb272;
                    }
                  }
                  iVar7 = noattacks(local_3510->data);
                  bVar9 = iVar7 != 0;
                }
              }
LAB_001eb272:
              if (((((((u.uprops[0x3e].intrinsic == 0) && (u.uprops[0x3e].extrinsic == 0)) &&
                     (((youmonst.data)->mflags1 & 8) == 0)) &&
                    ((bVar3 = can_ooze(&youmonst), bVar3 == '\0' &&
                     (bVar3 = closed_door(level,x_00,y_00), bVar3 != '\0')))) ||
                   (poVar8 = sobj_at(0x214,level,x_00,y_00), poVar8 != (obj *)0x0)) ||
                  ((bVar9 || (bVar3 = test_move(iVar5,uy_00,x_00 - iVar5,y_00 - uy_00,0,3),
                             bVar3 != '\0')))) &&
                 (nn + -5 < (int)travel[(long)iVar5 + -1][(long)uy_00 + 0x13])) {
                if (!bVar2) {
                  travelstepy[(long)(1 - i) + 1][(long)x + 0x688] = cVar4;
                  *(char *)((long)&n + (long)x + (long)(1 - i) * 0x690) = cVar1;
                  x = x + 1;
                  bVar2 = true;
                }
              }
              else {
                bVar3 = test_move(iVar5,uy_00,x_00 - iVar5,y_00 - uy_00,0,3);
                if (((bVar3 != '\0') ||
                    (bVar3 = test_move(iVar5,uy_00,x_00 - iVar5,y_00 - uy_00,0,2), bVar3 != '\0'))
                   && ((level->locations[x_00][y_00].seenv != '\0' ||
                       ((((u.uprops[0x1e].intrinsic == 0 &&
                          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                        ((viz_array[y_00][x_00] & 1U) != 0)))))) {
                  if ((x_00 == set._1_1_) && (y_00 == (xchar)set)) {
                    if (dx_local == (schar *)0x0) {
                      *dx = cVar4 - set._1_1_;
                      *dy = cVar1 - (xchar)set;
                      if ((iVar5 == u.tx) && (uy_00 == u.ty)) {
                        nomul(0,(char *)0x0);
                        flags.run = 8;
                        iflags.travelcc.y = -1;
                        iflags.travelcc.x = -1;
                      }
                      return '\x01';
                    }
                  }
                  else if (travel[(long)x_00 + -1][(long)y_00 + 0x13] == 0) {
                    travelstepy[(long)(1 - i) + 1][(long)x + 0x688] = (xchar)x_00;
                    *(char *)((long)&n + (long)x + (long)(1 - i) * 0x690) = (char)y_00;
                    travel[(long)x_00 + -1][(long)y_00 + 0x13] = nn;
                    x = x + 1;
                  }
                }
              }
            }
          }
        }
        i = 1 - i;
        nn = nn + 1;
        radius = x;
      }
      if (dx_local == (schar *)0x0) {
        return '\0';
      }
      dist = (int)set._3_1_;
      nxtdist = (int)set._2_1_;
      d2 = distmin((int)set._1_1_,(int)(xchar)set,(int)set._3_1_,(int)set._2_1_);
      iStack_3500 = dist2((int)set._1_1_,(int)(xchar)set,(int)set._3_1_,(int)set._2_1_);
      if ((code *)dx_local == unexplored) {
        d2 = 0x7fffffff;
        iStack_3500 = 0x7fffffff;
      }
      for (set._3_1_ = '\x01'; set._3_1_ < 'P'; set._3_1_ = set._3_1_ + '\x01') {
        for (set._2_1_ = '\0'; set._2_1_ < '\x15'; set._2_1_ = set._2_1_ + '\x01') {
          if (travel[(long)set._3_1_ + -1][(long)set._2_1_ + 0x13] != 0) {
            nd2 = distmin((int)set._1_1_,(int)(xchar)set,(int)set._3_1_,(int)set._2_1_);
            if ((code *)dx_local == unexplored) {
              nd2 = autotravel_weighting
                              ((int)set._3_1_,(int)set._2_1_,
                               travel[(long)set._3_1_ + -1][(long)set._2_1_ + 0x13]);
            }
            if ((nd2 == d2) && (cVar4 = (*(code *)dx_local)((int)set._3_1_), cVar4 != '\0')) {
              iVar5 = dist2((int)set._1_1_,(int)(xchar)set,(int)set._3_1_,(int)set._2_1_);
              if (iVar5 < iStack_3500) {
                dist = (int)set._3_1_;
                nxtdist = (int)set._2_1_;
                iStack_3500 = iVar5;
              }
            }
            else if ((nd2 < d2) && (cVar4 = (*(code *)dx_local)((int)set._3_1_), cVar4 != '\0')) {
              dist = (int)set._3_1_;
              nxtdist = (int)set._2_1_;
              d2 = nd2;
              iStack_3500 = dist2((int)set._1_1_,(int)(xchar)set,(int)set._3_1_,(int)set._2_1_);
            }
          }
        }
      }
      if ((dist == u.ux) && (nxtdist == u.uy)) goto code_r0x001eba17;
      set._3_1_ = (char)dist;
      set._2_1_ = (char)nxtdist;
      set._1_1_ = u.ux;
      set._0_1_ = u.uy;
      dx_local = (schar *)0x0;
    } while( true );
  }
LAB_001ebb36:
  *dx = '\0';
  *dy = '\0';
  nomul(0,(char *)0x0);
  return '\0';
code_r0x001eba17:
  iVar5 = sgn((int)u.tx - (int)u.ux);
  *dx = (schar)iVar5;
  iVar5 = sgn((int)u.ty - (int)u.uy);
  *dy = (schar)iVar5;
  if ((*dx == '\0') && (*dy == '\0')) {
    nomul(0,(char *)0x0);
    return '\0';
  }
  bVar3 = test_move((int)u.ux,(int)u.uy,(int)*dx,(int)*dy,0,1);
  if (bVar3 != '\0') {
    return '\x01';
  }
  goto LAB_001ebb36;
}

Assistant:

static boolean findtravelpath(boolean (*guess)(int, int), schar *dx, schar *dy)
{
    /* if travel to adjacent, reachable location, use normal movement rules */
    if (!guess && iflags.travel1 && distmin(u.ux, u.uy, u.tx, u.ty) == 1) {
	flags.run = 0;
	if (test_move(u.ux, u.uy, u.tx-u.ux, u.ty-u.uy, 0, TEST_MOVE)) {
	    *dx = u.tx-u.ux;
	    *dy = u.ty-u.uy;
	    nomul(0, NULL);
	    iflags.travelcc.x = iflags.travelcc.y = -1;
	    return TRUE;
	}
	flags.run = 8;
    }
    if (u.tx != u.ux || u.ty != u.uy || guess == unexplored) {
	unsigned travel[COLNO][ROWNO];
	xchar travelstepx[2][COLNO*ROWNO];
	xchar travelstepy[2][COLNO*ROWNO];
	xchar tx, ty, ux, uy;
	int n = 1;			/* max offset in travelsteps */
	int set = 0;			/* two sets current and previous */
	int radius = 1;			/* search radius */
	int i;

	/* If guessing, first find an "obvious" goal location.  The obvious
	 * goal is the position the player knows of, or might figure out
	 * (couldsee) that is closest to the target on a straight path.
	 */
	if (guess) {
	    tx = u.ux; ty = u.uy; ux = u.tx; uy = u.ty;
	} else {
	    tx = u.tx; ty = u.ty; ux = u.ux; uy = u.uy;
	}

    noguess:
	memset(travel, 0, sizeof(travel));
	travelstepx[0][0] = tx;
	travelstepy[0][0] = ty;

	while (n != 0) {
	    int nn = 0;

	    for (i = 0; i < n; i++) {
		int dir;
		int x = travelstepx[set][i];
		int y = travelstepy[set][i];
		static const int ordered[] = { 0, 2, 4, 6, 1, 3, 5, 7 };
		/* no diagonal movement for grid bugs */
		int dirmax = u.umonnum == PM_GRID_BUG ? 4 : 8;
		boolean alreadyrepeated = FALSE;

		for (dir = 0; dir < dirmax; ++dir) {
		    const struct monst *mtmp;
		    boolean divert_mon;
		    int nx = x+xdir[ordered[dir]];
		    int ny = y+ydir[ordered[dir]];

		    /*
		     * When guessing and trying to travel as close as possible
		     * to an unreachable target space, don't include spaces
		     * that would never be picked as a guessed target in the
		     * travel matrix describing player-reachable spaces.
		     * This stops travel from getting confused and moving the
		     * player back and forth in certain degenerate configurations
		     * of sight-blocking obstacles, e.g.
		     *
		     *    T         1. Dig this out and carry enough to not be
		     *      ####       able to squeeze through diagonal gaps.
		     *      #--.---    Stand at @ and target travel at space T.
		     *       @.....
		     *       |.....
		     *
		     *    T         2. couldsee() marks spaces marked a and x as
		     *      ####       eligible guess spaces to move the player
		     *      a--.---    towards.  Space a is closest to T, so it gets
		     *       @xxxxx    chosen.  Travel system moves @ right to travel
		     *       |xxxxx    to space a.
		     *
		     *    T         3. couldsee() marks spaces marked b, c and x
		     *      ####       as eligible guess spaces to move the player
		     *      a--c---    towards.  Since findtravelpath() is called
		     *       b@xxxx    repeatedly during travel, it doesn't remember
		     *       |xxxxx    that it wanted to go to space a, so in
		     *                 comparing spaces b and c, b is chosen, since
		     *                 it seems like the closest eligible space to T.
		     *                 Travel system moves @ left to go to space b.
		     *
		     *              4. Go to 2.
		     *
		     * By limiting the travel matrix here, space a in the example
		     * above is never included in it, preventing the cycle.
		     */
		    if (!isok(nx, ny) || (guess == couldsee_func && !guess(nx, ny)))
			continue;

		    /* Walk around monsters that just get in the way. */
		    mtmp = m_at(level, nx, ny);
		    divert_mon = (mtmp &&
				  /* can be seen or spotted */
				  canspotmon(level, mtmp) &&
				  mtmp->m_ap_type != M_AP_FURNITURE &&
				  mtmp->m_ap_type != M_AP_OBJECT &&
				  !(is_hider(mtmp->data) || mtmp->mundetected) &&
				  /* peaceful monsters */
				  ((mtmp->mpeaceful && !Hallucination) ||
				   /* monsters with no attacks */
				   noattacks(mtmp->data)));

		    if ((!Passes_walls && !can_ooze(&youmonst) &&
			 closed_door(level, nx, ny)) ||
			sobj_at(BOULDER, level, nx, ny) ||
			divert_mon ||
			test_move(x, y, nx-x, ny-y, 0, TEST_TRAP)) {
			/* closed doors and boulders usually
			 * cause a delay, so prefer another path */
			if ((int)travel[x][y] > radius-5) {
			    if (!alreadyrepeated) {
				travelstepx[1-set][nn] = x;
				travelstepy[1-set][nn] = y;
				/* don't change travel matrix! */
				nn++;
				alreadyrepeated = TRUE;
			    }
			    continue;
			}
		    }
		    if (test_move(x, y, nx-x, ny-y, 0, TEST_TRAP) ||
			test_move(x, y, nx-x, ny-y, 0, TEST_TRAV)) {
			if (level->locations[nx][ny].seenv ||
			    (!Blind && couldsee(nx, ny))) {
			    if (nx == ux && ny == uy) {
				if (!guess) {
				    *dx = x-ux;
				    *dy = y-uy;
				    if (x == u.tx && y == u.ty) {
					nomul(0, NULL);
					/* reset run so domove run checks work */
					flags.run = 8;
					iflags.travelcc.x = iflags.travelcc.y = -1;
				    }
				    return TRUE;
				}
			    } else if (!travel[nx][ny]) {
				travelstepx[1-set][nn] = nx;
				travelstepy[1-set][nn] = ny;
				travel[nx][ny] = radius;
				nn++;
			    }
			}
		    }
		}
	    }

	    n = nn;
	    set = 1-set;
	    radius++;
	}

	/* if guessing, find best location in travel matrix and go there */
	if (guess) {
	    int px = tx, py = ty;	/* pick location */
	    int dist, nxtdist, d2, nd2;
	    boolean autoexploring = (guess == unexplored);

	    dist = distmin(ux, uy, tx, ty);
	    d2 = dist2(ux, uy, tx, ty);
	    if (autoexploring) {
		dist = INT_MAX;
		d2 = INT_MAX;
	    }
	    for (tx = 1; tx < COLNO; ++tx) {
		for (ty = 0; ty < ROWNO; ++ty) {
		    if (travel[tx][ty]) {
			nxtdist = distmin(ux, uy, tx, ty);
			if (autoexploring)
			    nxtdist = autotravel_weighting(tx, ty, travel[tx][ty]);
			if (nxtdist == dist && guess(tx, ty)) {
			    nd2 = dist2(ux, uy, tx, ty);
			    if (nd2 < d2) {
				/* prefer non-zigzag path */
				px = tx; py = ty;
				d2 = nd2;
			    }
			} else if (nxtdist < dist && guess(tx, ty)) {
			    px = tx; py = ty;
			    dist = nxtdist;
			    d2 = dist2(ux, uy, tx, ty);
			}
		    }
		}
	    }

	    if (px == u.ux && py == u.uy) {
		/* no guesses, just go in the general direction */
		*dx = sgn(u.tx - u.ux);
		*dy = sgn(u.ty - u.uy);
		if (*dx == 0 && *dy == 0) {
		    nomul(0, NULL);
		    return FALSE;
		}
		if (test_move(u.ux, u.uy, *dx, *dy, 0, TEST_MOVE))
		    return TRUE;
		goto found;
	    }
	    tx = px;
	    ty = py;
	    ux = u.ux;
	    uy = u.uy;
	    set = 0;
	    n = radius = 1;
	    guess = NULL;
	    goto noguess;
	}
	return FALSE;
    }

found:
    *dx = 0;
    *dy = 0;
    nomul(0, NULL);
    return FALSE;
}